

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::x86::X86RAPass::_rewrite(X86RAPass *this,BaseNode *first,BaseNode *stop)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  RAStackSlot *pRVar7;
  BaseNode *pBVar8;
  bool bVar9;
  uint32_t uVar10;
  InstId IVar11;
  Error EVar12;
  Operand_ *pOVar13;
  Operand_ *other;
  VirtReg *pVVar14;
  long lVar15;
  InstNode *this_00;
  ulong uVar16;
  uint uVar17;
  BitWordIterator<unsigned_int> outIt;
  BitWordIterator<unsigned_int> useIt;
  ulong local_38;
  
  uVar3 = *(uint *)&(this->super_BaseRAPass).super_FuncPass.super_Pass._cb[1].super_BaseEmitter.
                    _code;
  do {
    while( true ) {
      do {
        this_00 = (InstNode *)first;
        if (this_00 == (InstNode *)stop) {
          return 0;
        }
        first = (this_00->super_BaseNode).field_0._links[1];
      } while (((this_00->super_BaseNode).field_1._any._nodeFlags & kActsAsInst) == kNone);
      plVar6 = (long *)(this_00->super_BaseNode)._passData;
      local_38 = (ulong)(this_00->super_BaseNode).field_1._any._reserved0;
      if (plVar6 != (long *)0x0) break;
LAB_0014290f:
      pOVar13 = this_00->_opArray;
      while (bVar9 = local_38 != 0, local_38 = local_38 - 1, bVar9) {
        if (((pOVar13->_signature)._bits & 0x2007) == 0x2002) {
          uVar10 = pOVar13->_baseId - 0x100;
          if (uVar3 <= uVar10) {
            return 0x1e;
          }
          pVVar14 = BaseCompiler::virtRegByIndex
                              ((BaseCompiler *)
                               (this->super_BaseRAPass).super_FuncPass.super_Pass._cb,uVar10);
          if (pVVar14->_workReg == (RAWorkReg *)0x0) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                       ,0x54e,"workReg != nullptr");
          }
          pRVar7 = pVVar14->_workReg->_stackSlot;
          iVar5 = pRVar7->_offset;
          BaseMem::_setBase((BaseMem *)pOVar13,
                            (byte)(this->super_BaseRAPass)._sp.super_Operand.super_Operand_.
                                  _signature._bits >> 3,(uint)pRVar7->_baseRegId);
          pbVar1 = (byte *)((long)&(pOVar13->_signature)._bits + 1);
          *pbVar1 = *pbVar1 & 0xdf;
          pOVar13->_data[1] = pOVar13->_data[1] + iVar5;
        }
        pOVar13 = pOVar13 + 1;
      }
    }
    (this_00->super_BaseNode)._passData = (void *)0x0;
    uVar4 = *(uint *)(plVar6 + 2);
    uVar17 = 0;
    for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
      lVar15 = uVar16 * 0x20;
      useIt._bitWord = *(uint *)((long)plVar6 + lVar15 + 100);
      bVar2 = *(byte *)((long)plVar6 + lVar15 + 0x5a);
      while (useIt._bitWord != 0) {
        if (uVar17 <= bVar2) {
          uVar17 = (uint)bVar2;
        }
        uVar10 = Support::BitWordIterator<unsigned_int>::next(&useIt);
        (&(((BaseInst *)(this_00->_opArray + -1))->_extraReg)._id)[uVar10] = (uint)bVar2;
      }
      outIt._bitWord = *(uint *)(plVar6 + uVar16 * 4 + 0xd);
      bVar2 = *(byte *)((long)plVar6 + lVar15 + 0x5b);
      while (outIt._bitWord != 0) {
        if (uVar17 <= bVar2) {
          uVar17 = (uint)bVar2;
        }
        uVar10 = Support::BitWordIterator<unsigned_int>::next(&outIt);
        (&(((BaseInst *)(this_00->_opArray + -1))->_extraReg)._id)[uVar10] = (uint)bVar2;
      }
    }
    if ((*(int *)((long)plVar6 + 0xc) < 0) && (0xf < uVar17)) {
      IVar11 = (this_00->_baseInst)._id;
      switch(IVar11) {
      case 0x61a:
        IVar11 = 0x614;
        break;
      case 0x61b:
        IVar11 = 0x616;
        break;
      case 0x61c:
        IVar11 = 0x617;
        break;
      case 0x61d:
        IVar11 = 0x619;
        break;
      default:
        if (IVar11 == 0x33c) {
          IVar11 = 0x33e;
        }
        else if (IVar11 == 0x5fb) {
          IVar11 = 0x5fc;
        }
        else if (IVar11 == 0x3b1) {
          IVar11 = 0x3b2;
        }
        else if (IVar11 == 0x3b6) {
          IVar11 = 0x3b7;
        }
        else if (IVar11 == 0x45f) {
          IVar11 = 0x460;
        }
        else if (IVar11 == 0x464) {
          IVar11 = 0x465;
        }
        else if (IVar11 == 0x485) {
          IVar11 = 0x486;
        }
        else if (IVar11 == 0x488) {
          IVar11 = 0x48a;
        }
        else if (IVar11 == 0x4c8) {
          IVar11 = 0x4c9;
        }
        else if (IVar11 == 0x4ca) {
          IVar11 = 0x4cb;
        }
        else if (IVar11 == 0x59b) {
          IVar11 = 0x59c;
        }
        else {
          if (IVar11 != 0x342) {
            DebugUtils::assertionFailed
                      ("/workspace/llm4binary/github/license_c_cmakelists/mitsuba-renderer[P]asmjit/src/asmjit/x86/x86rapass.cpp"
                       ,0x4eb,"false");
          }
          IVar11 = 0x344;
        }
      }
      (this_00->_baseInst)._id = IVar11;
    }
    if ((((*(byte *)(plVar6 + 1) & 1) == 0) ||
        ((this_00->_baseInst)._extraReg._signature._bits != 0)) ||
       ((this_00->super_BaseNode).field_1._any._reserved0 != '\x02')) {
LAB_00142900:
      if ((this_00->super_BaseNode).field_1._any._nodeType == kFuncRet) {
        lVar15 = *plVar6;
        bVar9 = BaseRAPass::isNextTo
                          (&this->super_BaseRAPass,&this_00->super_BaseNode,
                           &((this->super_BaseRAPass)._func)->_exitNode->super_BaseNode);
        if (!bVar9) {
          ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb)->_cursor =
               (this_00->super_BaseNode).field_0.field_0._prev;
          useIt._bitWord = 4;
          EVar12 = (*(this->super_BaseRAPass).super_FuncPass.super_Pass._vptr_Pass[0xd])
                             (this,&useIt);
          if (EVar12 != 0) {
            return EVar12;
          }
        }
        pBVar8 = (this_00->super_BaseNode).field_0.field_0._prev;
        BaseBuilder::removeNode
                  ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,&this_00->super_BaseNode);
        *(BaseNode **)(lVar15 + 0x18) = pBVar8;
      }
      goto LAB_0014290f;
    }
    pOVar13 = &InstNode::op(this_00,0)->super_Operand_;
    other = &InstNode::op(this_00,1)->super_Operand_;
    bVar9 = Operand_::equals(pOVar13,other);
    if (!bVar9) goto LAB_00142900;
    BaseBuilder::removeNode
              ((this->super_BaseRAPass).super_FuncPass.super_Pass._cb,&this_00->super_BaseNode);
  } while( true );
}

Assistant:

ASMJIT_FAVOR_SPEED Error X86RAPass::_rewrite(BaseNode* first, BaseNode* stop) noexcept {
  uint32_t virtCount = cc()->_vRegArray.size();

  BaseNode* node = first;
  while (node != stop) {
    BaseNode* next = node->next();
    if (node->isInst()) {
      InstNode* inst = node->as<InstNode>();
      RAInst* raInst = node->passData<RAInst>();

      Operand* operands = inst->operands();
      uint32_t opCount = inst->opCount();
      uint32_t maxRegId = 0;

      uint32_t i;

      // Rewrite virtual registers into physical registers.
      if (raInst) {
        // This data is allocated by Zone passed to `runOnFunction()`, which will be reset after the RA pass finishes.
        // So reset this data to prevent having a dead pointer after the RA pass is complete.
        node->resetPassData();

        // If the instruction contains pass data (raInst) then it was a subject for register allocation and must be
        // rewritten to use physical regs.
        RATiedReg* tiedRegs = raInst->tiedRegs();
        uint32_t tiedCount = raInst->tiedCount();

        for (i = 0; i < tiedCount; i++) {
          RATiedReg* tiedReg = &tiedRegs[i];

          Support::BitWordIterator<uint32_t> useIt(tiedReg->useRewriteMask());
          uint32_t useId = tiedReg->useId();
          while (useIt.hasNext()) {
            maxRegId = Support::max(maxRegId, useId);
            inst->rewriteIdAtIndex(useIt.next(), useId);
          }

          Support::BitWordIterator<uint32_t> outIt(tiedReg->outRewriteMask());
          uint32_t outId = tiedReg->outId();
          while (outIt.hasNext()) {
            maxRegId = Support::max(maxRegId, outId);
            inst->rewriteIdAtIndex(outIt.next(), outId);
          }
        }

        // Transform VEX instruction to EVEX when necessary.
        if (raInst->isTransformable()) {
          if (maxRegId > 15) {
            inst->setId(transformVexToEvex(inst->id()));
          }
        }

        // Remove moves that do not do anything.
        //
        // Usually these moves are inserted during code generation and originally they used different registers. If RA
        // allocated these into the same register such redundant mov would appear.
        if (raInst->hasInstRWFlag(InstRWFlags::kMovOp) && !inst->hasExtraReg()) {
          if (inst->opCount() == 2) {
            if (inst->op(0) == inst->op(1)) {
              cc()->removeNode(node);
              goto Next;
            }
          }
        }

        if (ASMJIT_UNLIKELY(node->type() != NodeType::kInst)) {
          // FuncRet terminates the flow, it must either be removed if the exit label is next to it (optimization) or
          // patched to an architecture dependent jump instruction that jumps to the function's exit before the epilog.
          if (node->type() == NodeType::kFuncRet) {
            RABlock* block = raInst->block();
            if (!isNextTo(node, _func->exitNode())) {
              cc()->_setCursor(node->prev());
              ASMJIT_PROPAGATE(emitJump(_func->exitNode()->label()));
            }

            BaseNode* prev = node->prev();
            cc()->removeNode(node);
            block->setLast(prev);
          }
        }
      }

      // Rewrite stack slot addresses.
      for (i = 0; i < opCount; i++) {
        Operand& op = operands[i];
        if (op.isMem()) {
          BaseMem& mem = op.as<BaseMem>();
          if (mem.isRegHome()) {
            uint32_t virtIndex = Operand::virtIdToIndex(mem.baseId());
            if (ASMJIT_UNLIKELY(virtIndex >= virtCount))
              return DebugUtils::errored(kErrorInvalidVirtId);

            VirtReg* virtReg = cc()->virtRegByIndex(virtIndex);
            RAWorkReg* workReg = virtReg->workReg();
            ASMJIT_ASSERT(workReg != nullptr);

            RAStackSlot* slot = workReg->stackSlot();
            int32_t offset = slot->offset();

            mem._setBase(_sp.type(), slot->baseRegId());
            mem.clearRegHome();
            mem.addOffsetLo32(offset);
          }
        }
      }
    }

Next:
    node = next;
  }

  return kErrorOk;
}